

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

LengthPercentage
Rml::ComputeOrigin(Property *property,float font_size,float document_font_size,float dp_ratio,
                  Vector2f vp_dimensions)

{
  char cVar1;
  int iVar2;
  NumericValue value;
  float fVar3;
  float local_30;
  OriginX origin;
  float percent;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  
  if (property->unit == KEYWORD) {
    local_30 = 0.0;
    iVar2 = Property::Get<int>(property);
    cVar1 = (char)iVar2;
    if (cVar1 == '\0') {
      local_30 = 0.0;
    }
    else if (cVar1 == '\x01') {
      local_30 = 50.0;
    }
    else if (cVar1 == '\x02') {
      local_30 = 100.0;
    }
    Style::LengthPercentage::LengthPercentage
              ((LengthPercentage *)&vp_dimensions_local,Percentage,local_30);
  }
  else if (property->unit == PERCENT) {
    fVar3 = Property::Get<float>(property);
    Style::LengthPercentage::LengthPercentage
              ((LengthPercentage *)&vp_dimensions_local,Percentage,fVar3);
  }
  else {
    value = Property::GetNumericValue(property);
    fVar3 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    Style::LengthPercentage::LengthPercentage((LengthPercentage *)&vp_dimensions_local,Length,fVar3)
    ;
  }
  return (LengthPercentage)vp_dimensions_local;
}

Assistant:

Style::LengthPercentage ComputeOrigin(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	static_assert(
		(int)OriginX::Left == (int)OriginY::Top && (int)OriginX::Center == (int)OriginY::Center && (int)OriginX::Right == (int)OriginY::Bottom, "");

	if (property->unit == Unit::KEYWORD)
	{
		float percent = 0.0f;
		OriginX origin = (OriginX)property->Get<int>();
		switch (origin)
		{
		case OriginX::Left: percent = 0.0f; break;
		case OriginX::Center: percent = 50.0f; break;
		case OriginX::Right: percent = 100.f; break;
		}
		return LengthPercentage(LengthPercentage::Percentage, percent);
	}
	else if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}